

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FSpecialAction,_FSpecialAction>::Reserve
          (TArray<FSpecialAction,_FSpecialAction> *this,uint amount)

{
  uint uVar1;
  FSpecialAction *pFVar2;
  ulong uVar3;
  
  Grow(this,amount);
  uVar1 = this->Count;
  uVar3 = (ulong)uVar1;
  this->Count = amount + uVar1;
  pFVar2 = this->Array + uVar3;
  for (; uVar3 < amount + uVar1; uVar3 = uVar3 + 1) {
    (pFVar2->Type).Index = 0;
    pFVar2 = pFVar2 + 1;
  }
  return uVar1;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}